

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O2

CSVGuessResult
csv::internals::_guess_format(string_view head,vector<char,_std::allocator<char>_> *delims)

{
  byte delim;
  byte *pbVar1;
  CSVFormat *pCVar2;
  CSVFormat *in_RCX;
  ulong uVar3;
  ulong uVar4;
  CSVFormat *this;
  size_t sVar5;
  const_iterator __begin2;
  byte *pbVar6;
  ulong uVar7;
  string_view head_00;
  GuessScore GVar8;
  CSVFormat format;
  CSVFormat local_88;
  
  head_00._M_len = head._M_str;
  CSVFormat::CSVFormat(&local_88);
  pbVar6 = (byte *)(delims->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  pbVar1 = (byte *)(delims->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  uVar4 = (ulong)*pbVar6;
  sVar5 = 0;
  uVar7 = 0;
  for (; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    delim = *pbVar6;
    this = &local_88;
    pCVar2 = CSVFormat::delimiter(this,delim);
    head_00._M_str = (char *)pCVar2;
    GVar8 = calculate_score((internals *)this,head_00,in_RCX);
    uVar3 = (ulong)GVar8.score;
    uVar3 = (long)(GVar8.score - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    in_RCX = (CSVFormat *)(ulong)delim;
    if (uVar7 < uVar3) {
      uVar4 = (ulong)delim;
      sVar5 = GVar8.header;
    }
    if (uVar7 <= uVar3) {
      uVar7 = uVar3;
    }
  }
  CSVFormat::~CSVFormat(&local_88);
  return (CSVGuessResult)(uVar4 | sVar5 << 0x20);
}

Assistant:

CSV_INLINE CSVGuessResult _guess_format(csv::string_view head, const std::vector<char>& delims) {
            /** For each delimiter, find out which row length was most common.
             *  The delimiter with the longest mode row length wins.
             *  Then, the line number of the header row is the first row with
             *  the mode row length.
             */

            CSVFormat format;
            size_t max_score = 0,
                header = 0;
            char current_delim = delims[0];

            for (char cand_delim : delims) {
                auto result = calculate_score(head, format.delimiter(cand_delim));

                if ((size_t)result.score > max_score) {
                    max_score = (size_t)result.score;
                    current_delim = cand_delim;
                    header = result.header;
                }
            }

            return { current_delim, (int)header };
        }